

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void write_s2stseg(char *dir,align_stseg_t *stseg,char *uttid,char *ctlspec,int32 cdsen)

{
  size_t sVar1;
  FILE *__stream;
  char local_462 [8];
  char buf [8];
  int16 s2_info;
  word_posn_t wpos;
  undefined1 auStack_44c [2];
  s3cipid_t ci [3];
  int32 k;
  align_stseg_t *tmp;
  FILE *fp;
  char filename [1024];
  int32 cdsen_local;
  char *ctlspec_local;
  char *uttid_local;
  align_stseg_t *stseg_local;
  char *dir_local;
  
  build_output_uttfile((char *)&fp,dir,uttid,ctlspec);
  strcat((char *)&fp,".v8_seg");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,0x14b,"Writing Sphinx-II format state segmentation to: %s\n",&fp);
  if ((cdsen != 0) &&
     (err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
              ,0x14d,"Writing context-dependent state indices in segmentation file\n"),
     0xffff < kbc->mdef->n_sen)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
            ,0x14f,"Number of senones exceeds 65535, cannot write them to segmentation file\n");
    return;
  }
  tmp = (align_stseg_t *)fopen((char *)&fp,"wb");
  if ((FILE *)tmp == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x154,"Failed to open %s for writing",&fp);
    return;
  }
  if (write_s2stseg::byterev < 0) {
    _auStack_44c = 0x11223344;
    sVar1 = fwrite(auStack_44c,4,1,(FILE *)tmp);
    if (sVar1 != 1) goto LAB_0011a2ab;
    fclose((FILE *)tmp);
    __stream = fopen((char *)&fp,"rb");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                     ,0x160,"Failed to open file %s for reading",&fp);
      return;
    }
    sVar1 = fread(local_462,1,4,__stream);
    if (sVar1 != 4) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                     ,0x164,"Failed to read from the file %s",&fp);
      return;
    }
    fclose(__stream);
    write_s2stseg::byterev = (int32)(local_462[0] == 'D');
    tmp = (align_stseg_t *)fopen((char *)&fp,"wb");
    if ((FILE *)tmp == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                     ,0x16d,"Failed to open file %s for writing",&fp);
      return;
    }
  }
  _auStack_44c = 0;
  for (unique0x100003ab = stseg; stack0xfffffffffffffbb8 != (align_stseg_t *)0x0;
      unique0x00012000 = stack0xfffffffffffffbb8->next) {
    _auStack_44c = _auStack_44c + 1;
  }
  if (write_s2stseg::byterev != 0) {
    _auStack_44c = (int)_auStack_44c >> 0x18 & 0xffU | (int)_auStack_44c >> 8 & 0xff00U |
                   (_auStack_44c & 0xff00) << 8 | _auStack_44c << 0x18;
  }
  sVar1 = fwrite(auStack_44c,4,1,(FILE *)tmp);
  uttid_local = (char *)stseg;
  if (sVar1 == 1) {
    while( true ) {
      if (uttid_local == (char *)0x0) {
        fclose((FILE *)tmp);
        return;
      }
      if (cdsen == 0) {
        mdef_phone_components
                  (kbc->mdef,*(s3pid_t *)uttid_local,&s2_info,(s3cipid_t *)&wpos,
                   (s3cipid_t *)((long)&wpos + 2),(word_posn_t *)(buf + 2));
        buf._0_2_ = s2_info * (short)kbc->mdef->n_emit_state + (short)uttid_local[6];
        if (uttid_local[7] != '\0') {
          buf._0_2_ = buf._0_2_ | 0x8000;
        }
      }
      else {
        buf._0_2_ = *(undefined2 *)(uttid_local + 4);
      }
      if (write_s2stseg::byterev != 0) {
        buf._0_2_ = (ushort)buf._0_2_ >> 8 | buf._0_2_ << 8;
      }
      sVar1 = fwrite(buf,2,1,(FILE *)tmp);
      if (sVar1 != 1) break;
      uttid_local = *(char **)(uttid_local + 0x10);
    }
  }
LAB_0011a2ab:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                 ,400,"Failed to write data to the file %s",&fp);
  fclose((FILE *)tmp);
  return;
}

Assistant:

static void
write_s2stseg(char *dir, align_stseg_t * stseg, char *uttid, char *ctlspec, int32 cdsen)
{
    char filename[1024];
    FILE *fp;
    align_stseg_t *tmp;
    int32 k;
    s3cipid_t ci[3];
    word_posn_t wpos;
    int16 s2_info;
    char buf[8];
    static int32 byterev = -1;  /* Whether to byte reverse output data */

    build_output_uttfile(filename, dir, uttid, ctlspec);
    strcat(filename, ".v8_seg");        /* .v8_seg for compatibility */
    E_INFO("Writing Sphinx-II format state segmentation to: %s\n",
           filename);
    if (cdsen) {
        E_INFO("Writing context-dependent state indices in segmentation file\n");
        if (mdef_n_sen(kbc->mdef) > 0xffff) {
            E_ERROR("Number of senones exceeds 65535, cannot write them to segmentation file\n");
            return;
        }
    }
    if ((fp = fopen(filename, "wb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open %s for writing", filename);
        return;
    }

    if (byterev < 0) {
        /* Byte ordering of host machine unknown; first figure it out */
        k = (int32) BYTE_ORDER_MAGIC;
        if (fwrite(&k, sizeof(int32), 1, fp) != 1)
            goto write_error;

        fclose(fp);
        if ((fp = fopen(filename, "rb")) == NULL) {
            E_ERROR_SYSTEM("Failed to open file %s for reading", filename);
            return;
        }
        if (fread(buf, 1, sizeof(int32), fp) != sizeof(int32)) {
            E_ERROR_SYSTEM("Failed to read from the file %s", filename);
            return;
        }
        fclose(fp);

        /* If buf[0] == lsB of BYTE_ORDER_MAGIC, we are little-endian.  Need to byterev */
        byterev = (buf[0] == (BYTE_ORDER_MAGIC & 0x000000ff)) ? 1 : 0;

        if ((fp = fopen(filename, "wb")) == NULL) {
            E_ERROR_SYSTEM("Failed to open file %s for writing", filename);
            return;
        }
    }

    /* Write #frames */
    for (k = 0, tmp = stseg; tmp; k++, tmp = tmp->next);
    if (byterev)
        SWAP_INT32(&k);
    if (fwrite(&k, sizeof(int32), 1, fp) != 1)
        goto write_error;

    /* Write state info for each frame */
    for (; stseg; stseg = stseg->next) {
        if (cdsen) {
            s2_info = stseg->sen;
        }
        else {
            mdef_phone_components(kbc->mdef, stseg->pid, ci, &(ci[1]),
                                  &(ci[2]), &wpos);
            s2_info = ci[0] * kbc->mdef->n_emit_state + stseg->state;
            if (stseg->start)
                s2_info |= 0x8000;
        }
        if (byterev)
            SWAP_INT16(&s2_info);

        if (fwrite(&s2_info, sizeof(int16), 1, fp) != 1)
            goto write_error;
    }

    fclose(fp);
    return;

  write_error:
    E_ERROR_SYSTEM("Failed to write data to the file %s", filename);
    fclose(fp);
}